

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# knownhost.c
# Opt level: O1

int knownhost_add(LIBSSH2_KNOWNHOSTS *hosts,char *host,char *salt,char *key_type_name,
                 size_t key_type_len,char *key,size_t keylen,char *comment,size_t commentlen,
                 int typemask,libssh2_knownhost **store)

{
  size_t sVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  known_host *entry;
  char *pcVar5;
  long lVar6;
  size_t sVar7;
  char *pcVar8;
  LIBSSH2_SESSION *pLVar9;
  char *local_78;
  char *local_70;
  char *local_68;
  size_t local_60;
  size_t local_58;
  libssh2_knownhost **local_50;
  char *local_48;
  size_t local_40;
  size_t local_38;
  
  local_50 = store;
  local_40 = commentlen;
  local_48 = comment;
  local_38 = keylen;
  local_70 = key;
  local_68 = key_type_name;
  local_58 = key_type_len;
  sVar4 = strlen(host);
  pLVar9 = hosts->session;
  if ((typemask & 0x3c0000U) == 0) {
    pcVar5 = "No key type set";
    iVar3 = -0x22;
LAB_00119561:
    iVar3 = _libssh2_error(pLVar9,iVar3,pcVar5);
    return iVar3;
  }
  entry = (known_host *)_libssh2_calloc(pLVar9,0x90);
  if (entry == (known_host *)0x0) {
    pLVar9 = hosts->session;
    pcVar5 = "Unable to allocate memory for known host entry";
    iVar3 = -6;
    goto LAB_00119561;
  }
  entry->typemask = typemask;
  if ((short)typemask == 3) {
LAB_001194c1:
    pcVar5 = (char *)(*hosts->session->alloc)(sVar4 + 1,&hosts->session->abstract);
    entry->name = pcVar5;
    if (pcVar5 == (char *)0x0) {
      pLVar9 = hosts->session;
      pcVar5 = "Unable to allocate memory for host name";
      iVar3 = -6;
LAB_001195cb:
      iVar3 = _libssh2_error(pLVar9,iVar3,pcVar5);
      goto LAB_001197f8;
    }
    memcpy(pcVar5,host,sVar4 + 1);
    lVar6 = 0x20;
    local_60 = sVar4;
  }
  else {
    if ((typemask & 0xffffU) != 2) {
      if ((typemask & 0xffffU) == 1) goto LAB_001194c1;
      pLVar9 = hosts->session;
      pcVar5 = "Unknown host name type";
      iVar3 = -0x21;
      goto LAB_001195cb;
    }
    iVar3 = _libssh2_base64_decode(hosts->session,&local_78,&local_60,host,sVar4);
    if (iVar3 != 0) goto LAB_001197f8;
    entry->name = local_78;
    entry->name_len = local_60;
    pLVar9 = hosts->session;
    sVar4 = strlen(salt);
    iVar3 = _libssh2_base64_decode(pLVar9,&local_78,&local_60,salt,sVar4);
    if (iVar3 != 0) goto LAB_001197f8;
    entry->salt = local_78;
    lVar6 = 0x38;
  }
  *(size_t *)((long)&(entry->node).next + lVar6) = local_60;
  if (((uint)typemask >> 0x11 & 1) == 0) {
    sVar7 = _libssh2_base64_encode(hosts->session,local_70,local_38,&local_78);
    if (sVar7 == 0) {
      iVar3 = _libssh2_error(hosts->session,-6,"Unable to allocate memory for base64-encoded key");
      iVar2 = 3;
    }
    else {
      entry->key = local_78;
      iVar3 = 0;
      iVar2 = 0;
    }
    if (iVar2 == 3) goto LAB_001197f8;
    if (iVar2 != 0) {
      return iVar3;
    }
LAB_001196ab:
    sVar1 = local_40;
    pcVar5 = local_48;
    sVar7 = local_58;
    if ((typemask & 0x3c0000U) == 0x3c0000 && local_68 != (char *)0x0) {
      pcVar8 = (char *)(*hosts->session->alloc)(local_58 + 1,&hosts->session->abstract);
      entry->key_type_name = pcVar8;
      if (pcVar8 == (char *)0x0) {
        pLVar9 = hosts->session;
        pcVar5 = "Unable to allocate memory for key type";
        goto LAB_001197eb;
      }
      memcpy(pcVar8,local_68,sVar7);
      entry->key_type_name[sVar7] = '\0';
      entry->key_type_len = sVar7;
    }
    if (pcVar5 == (char *)0x0) {
      entry->comment = (char *)0x0;
LAB_00119757:
      _libssh2_list_add(&hosts->head,(list_node *)entry);
      if (local_50 != (libssh2_knownhost **)0x0) {
        (entry->external).magic = 0xdeadcafe;
        (entry->external).node = entry;
        iVar3 = entry->typemask;
        if ((short)iVar3 == 1) {
          pcVar5 = entry->name;
        }
        else {
          pcVar5 = (char *)0x0;
        }
        (entry->external).name = pcVar5;
        (entry->external).key = entry->key;
        (entry->external).typemask = iVar3;
        *local_50 = &entry->external;
        return 0;
      }
      return 0;
    }
    pcVar8 = (char *)(*hosts->session->alloc)(sVar1 + 1,&hosts->session->abstract);
    entry->comment = pcVar8;
    if (pcVar8 != (char *)0x0) {
      memcpy(pcVar8,pcVar5,sVar1 + 1);
      entry->comment[sVar1] = '\0';
      entry->comment_len = sVar1;
      goto LAB_00119757;
    }
    pLVar9 = hosts->session;
    pcVar5 = "Unable to allocate memory for comment";
  }
  else {
    sVar7 = local_38;
    if (local_38 == 0) {
      sVar7 = strlen(local_70);
    }
    pcVar5 = (char *)(*hosts->session->alloc)(sVar7 + 1,&hosts->session->abstract);
    entry->key = pcVar5;
    if (pcVar5 != (char *)0x0) {
      memcpy(pcVar5,local_70,sVar7 + 1);
      entry->key[sVar7] = '\0';
      goto LAB_001196ab;
    }
    pLVar9 = hosts->session;
    pcVar5 = "Unable to allocate memory for key";
  }
LAB_001197eb:
  iVar3 = _libssh2_error(pLVar9,-6,pcVar5);
LAB_001197f8:
  free_host(hosts->session,entry);
  return iVar3;
}

Assistant:

static int
knownhost_add(LIBSSH2_KNOWNHOSTS *hosts,
              const char *host, const char *salt,
              const char *key_type_name, size_t key_type_len,
              const char *key, size_t keylen,
              const char *comment, size_t commentlen,
              int typemask, struct libssh2_knownhost **store)
{
    struct known_host *entry;
    size_t hostlen = strlen(host);
    int rc;
    char *ptr;
    size_t ptrlen;

    /* make sure we have a key type set */
    if(!(typemask & LIBSSH2_KNOWNHOST_KEY_MASK))
        return _libssh2_error(hosts->session, LIBSSH2_ERROR_INVAL,
                              "No key type set");

    entry = LIBSSH2_CALLOC(hosts->session, sizeof(struct known_host));
    if(!entry)
        return _libssh2_error(hosts->session, LIBSSH2_ERROR_ALLOC,
                              "Unable to allocate memory for known host "
                              "entry");

    entry->typemask = typemask;

    switch(entry->typemask  & LIBSSH2_KNOWNHOST_TYPE_MASK) {
    case LIBSSH2_KNOWNHOST_TYPE_PLAIN:
    case LIBSSH2_KNOWNHOST_TYPE_CUSTOM:
        entry->name = LIBSSH2_ALLOC(hosts->session, hostlen + 1);
        if(!entry->name) {
            rc = _libssh2_error(hosts->session, LIBSSH2_ERROR_ALLOC,
                                "Unable to allocate memory for host name");
            goto error;
        }
        memcpy(entry->name, host, hostlen + 1);
        entry->name_len = hostlen;
        break;
    case LIBSSH2_KNOWNHOST_TYPE_SHA1:
        rc = _libssh2_base64_decode(hosts->session, &ptr, &ptrlen,
                                    host, hostlen);
        if(rc)
            goto error;
        entry->name = ptr;
        entry->name_len = ptrlen;

        rc = _libssh2_base64_decode(hosts->session, &ptr, &ptrlen,
                                    salt, strlen(salt));
        if(rc)
            goto error;
        entry->salt = ptr;
        entry->salt_len = ptrlen;
        break;
    default:
        rc = _libssh2_error(hosts->session, LIBSSH2_ERROR_METHOD_NOT_SUPPORTED,
                            "Unknown host name type");
        goto error;
    }

    if(typemask & LIBSSH2_KNOWNHOST_KEYENC_BASE64) {
        /* the provided key is base64 encoded already */
        if(!keylen)
            keylen = strlen(key);
        entry->key = LIBSSH2_ALLOC(hosts->session, keylen + 1);
        if(!entry->key) {
            rc = _libssh2_error(hosts->session, LIBSSH2_ERROR_ALLOC,
                                "Unable to allocate memory for key");
            goto error;
        }
        memcpy(entry->key, key, keylen + 1);
        entry->key[keylen] = 0; /* force a terminating zero trailer */
    }
    else {
        /* key is raw, we base64 encode it and store it as such */
        size_t nlen = _libssh2_base64_encode(hosts->session, key, keylen,
                                             &ptr);
        if(!nlen) {
            rc = _libssh2_error(hosts->session, LIBSSH2_ERROR_ALLOC,
                                "Unable to allocate memory for "
                                "base64-encoded key");
            goto error;
        }

        entry->key = ptr;
    }

    if(key_type_name && ((typemask & LIBSSH2_KNOWNHOST_KEY_MASK) ==
                          LIBSSH2_KNOWNHOST_KEY_UNKNOWN)) {
        entry->key_type_name = LIBSSH2_ALLOC(hosts->session, key_type_len + 1);
        if(!entry->key_type_name) {
            rc = _libssh2_error(hosts->session, LIBSSH2_ERROR_ALLOC,
                                "Unable to allocate memory for key type");
            goto error;
        }
        memcpy(entry->key_type_name, key_type_name, key_type_len);
        entry->key_type_name[key_type_len] = 0;
        entry->key_type_len = key_type_len;
    }

    if(comment) {
        entry->comment = LIBSSH2_ALLOC(hosts->session, commentlen + 1);
        if(!entry->comment) {
            rc = _libssh2_error(hosts->session, LIBSSH2_ERROR_ALLOC,
                                "Unable to allocate memory for comment");
            goto error;
        }
        memcpy(entry->comment, comment, commentlen + 1);
        entry->comment[commentlen] = 0; /* force a terminating zero trailer */
        entry->comment_len = commentlen;
    }
    else {
        entry->comment = NULL;
    }

    /* add this new host to the big list of known hosts */
    _libssh2_list_add(&hosts->head, &entry->node);

    if(store)
        *store = knownhost_to_external(entry);

    return LIBSSH2_ERROR_NONE;
error:
    free_host(hosts->session, entry);
    return rc;
}